

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::expr_peek_abi_cxx11_(string *__return_storage_ptr__,InputAPI *this)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  InputAPI *local_18;
  InputAPI *this_local;
  string *s;
  
  local_19 = 0;
  local_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->type_ == DEFAULT) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_40,"*",&poVar1->yycursor);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (this->type_ == CUSTOM) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_70,&poVar1->yypeek," ()");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::expr_peek () const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = "*" + opts->yycursor;
			break;
		case CUSTOM:
			s = opts->yypeek + " ()";
			break;
	}
	return s;
}